

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::btGeneric6DofSpring2Constraint
          (btGeneric6DofSpring2Constraint *this,btRigidBody *rbA,btRigidBody *rbB,
          btTransform *frameInA,btTransform *frameInB,RotateOrder rotOrder)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  
  btTypedConstraint::btTypedConstraint
            (&this->super_btTypedConstraint,D6_SPRING_2_CONSTRAINT_TYPE,rbA,rbB);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_00220280;
  uVar2 = *(undefined8 *)((frameInA->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[0].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInA->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[1].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInA->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[2].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInA->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_origin.m_floats = *(undefined8 *)(frameInA->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInA).m_origin.m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInB->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInB->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInB->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInB->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_origin.m_floats = *(undefined8 *)(frameInB->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInB).m_origin.m_floats + 2) = uVar2;
  (this->m_linearLimits).m_lowerLimit.m_floats[0] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[1] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[2] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[3] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[0] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[1] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[2] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[3] = 0.0;
  (this->m_linearLimits).m_bounce.m_floats[0] = 0.0;
  (this->m_linearLimits).m_bounce.m_floats[1] = 0.0;
  (this->m_linearLimits).m_bounce.m_floats[2] = 0.0;
  (this->m_linearLimits).m_bounce.m_floats[3] = 0.0;
  (this->m_linearLimits).m_stopERP.m_floats[0] = 0.2;
  (this->m_linearLimits).m_stopERP.m_floats[1] = 0.2;
  (this->m_linearLimits).m_stopERP.m_floats[2] = 0.2;
  (this->m_linearLimits).m_stopCFM.m_floats[3] = 0.0;
  *(undefined8 *)((this->m_linearLimits).m_stopERP.m_floats + 3) = 0;
  (this->m_linearLimits).m_stopCFM.m_floats[1] = 0.0;
  (this->m_linearLimits).m_stopCFM.m_floats[2] = 0.0;
  (this->m_linearLimits).m_motorERP.m_floats[0] = 0.9;
  (this->m_linearLimits).m_motorERP.m_floats[1] = 0.9;
  (this->m_linearLimits).m_motorERP.m_floats[2] = 0.9;
  (this->m_linearLimits).m_servoTarget.m_floats[2] = 0.0;
  (this->m_linearLimits).m_servoTarget.m_floats[0] = 0.0;
  (this->m_linearLimits).m_servoTarget.m_floats[1] = 0.0;
  (this->m_linearLimits).m_springStiffness.m_floats[2] = 0.0;
  (this->m_linearLimits).m_springStiffness.m_floats[0] = 0.0;
  (this->m_linearLimits).m_springStiffness.m_floats[1] = 0.0;
  (this->m_linearLimits).m_springStiffnessLimited[2] = false;
  (this->m_linearLimits).m_springStiffnessLimited[0] = false;
  (this->m_linearLimits).m_springStiffnessLimited[1] = false;
  (this->m_linearLimits).m_springDamping.m_floats[2] = 0.0;
  (this->m_linearLimits).m_springDamping.m_floats[0] = 0.0;
  (this->m_linearLimits).m_springDamping.m_floats[1] = 0.0;
  (this->m_linearLimits).m_springDampingLimited[2] = false;
  (this->m_linearLimits).m_springDampingLimited[0] = false;
  (this->m_linearLimits).m_springDampingLimited[1] = false;
  (this->m_linearLimits).m_equilibriumPoint.m_floats[2] = 0.0;
  (this->m_linearLimits).m_equilibriumPoint.m_floats[0] = 0.0;
  (this->m_linearLimits).m_equilibriumPoint.m_floats[1] = 0.0;
  (this->m_linearLimits).m_targetVelocity.m_floats[2] = 0.0;
  (this->m_linearLimits).m_targetVelocity.m_floats[0] = 0.0;
  (this->m_linearLimits).m_targetVelocity.m_floats[1] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[2] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[0] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[1] = 0.0;
  *(undefined8 *)((long)(this->m_linearLimits).m_motorCFM.m_floats + 9) = 0;
  *(undefined8 *)((this->m_linearLimits).m_enableMotor + 1) = 0;
  *(undefined8 *)((this->m_linearLimits).m_motorERP.m_floats + 3) = 0;
  (this->m_linearLimits).m_motorCFM.m_floats[1] = 0.0;
  (this->m_linearLimits).m_motorCFM.m_floats[2] = 0.0;
  *(undefined8 *)((this->m_linearLimits).m_currentLinearDiff.m_floats + 3) = 0;
  (this->m_linearLimits).m_currentLimit[1] = 0;
  (this->m_linearLimits).m_currentLimit[2] = 0;
  (this->m_linearLimits).m_currentLinearDiff.m_floats[0] = 0.0;
  (this->m_linearLimits).m_currentLinearDiff.m_floats[1] = 0.0;
  (this->m_linearLimits).m_currentLinearDiff.m_floats[2] = 0.0;
  (this->m_linearLimits).m_currentLinearDiff.m_floats[3] = 0.0;
  (this->m_linearLimits).m_currentLimitErrorHi.m_floats[0] = 0.0;
  (this->m_linearLimits).m_currentLimitErrorHi.m_floats[1] = 0.0;
  (this->m_linearLimits).m_currentLimitErrorHi.m_floats[2] = 0.0;
  (this->m_linearLimits).m_currentLimitErrorHi.m_floats[3] = 0.0;
  (this->m_linearLimits).m_currentLimitError.m_floats[0] = 0.0;
  (this->m_linearLimits).m_currentLimitError.m_floats[1] = 0.0;
  (this->m_linearLimits).m_currentLimitError.m_floats[2] = 0.0;
  (this->m_linearLimits).m_currentLimitError.m_floats[3] = 0.0;
  lVar3 = 0x424;
  do {
    puVar1 = (undefined8 *)((long)this + lVar3 + -0x44);
    *puVar1 = 0xbf8000003f800000;
    puVar1[1] = 0x3e4ccccd00000000;
    *(undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x7c) =
         0x3f66666600000000;
    *(undefined4 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x74) = 0;
    *(undefined1 *)((long)((this->m_frameInA).m_basis.m_el + -7) + lVar3) = 0;
    *(undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x6c) =
         0x3dcccccd00000000;
    *(undefined1 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -100) = 0;
    *(undefined4 *)((long)(&(this->m_frameInA).m_basis + -2) + lVar3) = 0;
    *(undefined1 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x5c) = 0;
    *(undefined4 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x58) = 0;
    *(undefined1 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x54) = 0;
    *(undefined4 *)((long)((this->m_frameInA).m_basis.m_el + -5) + lVar3) = 0;
    *(undefined1 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x4c) = 0;
    puVar1 = (undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x48);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x38) = 0;
    lVar3 = lVar3 + 0x58;
  } while (lVar3 != 0x52c);
  this->m_rotateOrder = rotOrder;
  this->m_flags = 0;
  calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform,
                      &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                       m_worldTransform);
  return;
}

Assistant:

btGeneric6DofSpring2Constraint::btGeneric6DofSpring2Constraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB, RotateOrder rotOrder)
	: btTypedConstraint(D6_SPRING_2_CONSTRAINT_TYPE, rbA, rbB)
	, m_frameInA(frameInA)
	, m_frameInB(frameInB)
	, m_rotateOrder(rotOrder)	
	, m_flags(0)
{
	calculateTransforms();
}